

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O1

void incdec_verify::PostDecTestInt16(void)

{
  bool expected;
  short t;
  long lVar1;
  string local_50;
  
  lVar1 = 4;
  do {
    t = *(short *)(&UNK_0014dbdc + lVar1);
    if (t == -0x8000) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = *(bool *)((long)&dec_int16 + lVar1);
    if (expected != true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case dec_int16 throw (2): ","");
      err_msg<short>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 6;
  } while (lVar1 != 0x3a);
  return;
}

Assistant:

void PostDecTestInt16()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int16); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int16_t > si(dec_int16[i].x);
			SafeInt< std::int16_t > vv = si--;

			if(vv != dec_int16[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int16[i].fExpected )
		{
			err_msg( "Error in case dec_int16 throw (2): ", dec_int16[i].x, dec_int16[i].fExpected );
		}
	}
}